

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurbs.h
# Opt level: O0

Index anurbs::Nurbs::
      upper_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                (Index degree,
                Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots,
                double *t)

{
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *first;
  Index IVar1;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_48;
  double *local_20;
  double *t_local;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots_local;
  Index degree_local;
  
  local_20 = t;
  t_local = (double *)knots;
  knots_local = (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                degree;
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::Ref
            (&local_48,knots);
  first = knots_local;
  IVar1 = length<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                    ((Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *
                     )t_local);
  IVar1 = upper_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                    (&local_48,(Index)first,IVar1 - (long)knots_local,*local_20);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_48);
  return IVar1 + -1;
}

Assistant:

static Index upper_span(const Index degree, const TKnots& knots, const double& t)
    {
        return upper_bound(knots, degree, length(knots) - degree, t) - 1;
    }